

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPU.cpp
# Opt level: O3

void __thiscall PPU::spritePixel(PPU *this,uint8_t *index,uint8_t *sprite)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  
  if (((this->PPUMASK & 0x10) != 0) && (0 < (long)this->spriteCount)) {
    lVar1 = 0;
    do {
      uVar3 = ~(uint)this->spritePositions[lVar1] + this->cycle;
      if (uVar3 < 8) {
        uVar3 = this->spritePatterns[lVar1] >> ((char)uVar3 * -4 + 0x1cU & 0x1f);
        if ((uVar3 & 3) != 0) {
          bVar2 = (byte)uVar3 & 0xf;
          goto LAB_00110e6d;
        }
      }
      lVar1 = lVar1 + 1;
    } while (this->spriteCount != lVar1);
  }
  lVar1 = 0;
  bVar2 = 0;
LAB_00110e6d:
  *index = (uint8_t)lVar1;
  *sprite = bVar2;
  return;
}

Assistant:

void PPU::spritePixel(uint8_t &index, uint8_t &sprite) {
    if (!(PPUMASK & flagShowSprites)) {
        index = 0;
        sprite = 0;
        return;
    }
    for (int i = 0; i < spriteCount; i++) {
        int offset = (cycle - 1) - spritePositions[i];
        if (offset < 0 || offset > 7) {
            continue;
        }
        offset = 7 - offset;
        uint8_t color = uint8_t((spritePatterns[i] >> (offset * 4)) & 0x0F);
        if ((color % 4) == 0) {
            continue;
        }
        index = i;
        sprite = color;
        return;
    }
    index = 0;
    sprite = 0;
    return;
}